

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O2

void __thiscall
helics::CommsInterface::setRequireBrokerConnection
          (CommsInterface *this,bool requireBrokerConnection)

{
  bool bVar1;
  
  bVar1 = propertyLock(this);
  if (bVar1) {
    this->mRequireBrokerConnection = requireBrokerConnection;
    propertyUnLock(this);
    return;
  }
  return;
}

Assistant:

void CommsInterface::setRequireBrokerConnection(bool requireBrokerConnection)
{
    if (propertyLock()) {
        mRequireBrokerConnection = requireBrokerConnection;
        propertyUnLock();
    }
}